

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_index_of(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDI;
  size_t idx;
  vm_val_t subval;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_index_of::desc,1);
    __cxa_guard_release(&getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    CVmStack::pop((vm_val_t *)&stack0xffffffffffffffc8);
    iVar1 = find_in_list(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         (size_t *)in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      vm_val_t::set_nil(in_RDI);
    }
    else {
      vm_val_t::set_int(in_RDI,(int32_t)in_stack_ffffffffffffffc0);
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_index_of(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *lst, uint *argc)
{
    vm_val_t subval;
    size_t idx;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the value to find */
    G_stk->pop(&subval);

    /* find the value in the list */
    if (find_in_list(vmg_ self_val, &subval, &idx))
    {
        /* found it - adjust to 1-based index for return */
        retval->set_int(idx);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}